

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.c
# Opt level: O3

int quicly_loss_init_sentmap_iter
              (quicly_loss_t *loss,quicly_sentmap_iter_t *iter,int64_t now,uint32_t max_ack_delay,
              int is_closing)

{
  uint32_t uVar1;
  st_quicly_sent_block_t *psVar2;
  quicly_sent_acked_cb p_Var3;
  uint32_t uVar4;
  int iVar5;
  size_t sVar6;
  quicly_sent_t *pqVar7;
  
  iter->ref = &(loss->sentmap).head;
  psVar2 = (loss->sentmap).head;
  if (psVar2 == (st_quicly_sent_block_t *)0x0) {
    iter->p = &quicly_sentmap__end_iter;
    sVar6 = 0;
  }
  else {
    sVar6 = psVar2->num_entries;
    if (sVar6 == 0) {
      __assert_fail("map->head->num_entries != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                    ,0x12f,
                    "void quicly_sentmap_init_iter(quicly_sentmap_t *, quicly_sentmap_iter_t *)");
    }
    pqVar7 = (quicly_sent_t *)((long)&psVar2[-1].entries[0xf].data + 0x10);
    do {
      p_Var3 = pqVar7[1].acked;
      pqVar7 = pqVar7 + 1;
    } while (p_Var3 == (quicly_sent_acked_cb)0x0);
    iter->p = pqVar7;
    if (p_Var3 != quicly_sentmap__type_packet) {
      __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                    ,0x132,
                    "void quicly_sentmap_init_iter(quicly_sentmap_t *, quicly_sentmap_iter_t *)");
    }
  }
  iter->count = sVar6;
  uVar4 = (loss->rtt).variance;
  if (uVar4 == 0) {
    uVar4 = loss->conf->min_pto;
  }
  else {
    uVar4 = uVar4 << 2;
  }
  uVar1 = (loss->rtt).smoothed;
  while( true ) {
    pqVar7 = iter->p;
    if (pqVar7->acked != quicly_sentmap__type_packet) {
      __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                    ,0x13c,"const quicly_sent_packet_t *quicly_sentmap_get(quicly_sentmap_iter_t *)"
                   );
    }
    if ((long)(now - (ulong)((max_ack_delay + uVar1 + uVar4) * 4)) < (pqVar7->data).packet.sent_at)
    {
      return 0;
    }
    if ((pqVar7->data).packet.cc_bytes_in_flight != 0) {
      return 0;
    }
    if ((is_closing == 0) && ((loss->sentmap).num_packets < 0x20)) break;
    iVar5 = quicly_sentmap_update(&loss->sentmap,iter,QUICLY_SENTMAP_EVENT_EXPIRED);
    if (iVar5 != 0) {
      return iVar5;
    }
  }
  return 0;
}

Assistant:

int quicly_loss_init_sentmap_iter(quicly_loss_t *loss, quicly_sentmap_iter_t *iter, int64_t now, uint32_t max_ack_delay,
                                  int is_closing)
{
    quicly_sentmap_init_iter(&loss->sentmap, iter);

    int64_t retire_before = now - quicly_loss_get_sentmap_expiration_time(loss, max_ack_delay);

    /* Retire entries older than the time specified, unless the connection is alive and the number of packets in the sentmap is
     * below 32 packets. This exception (the threshold of 32) exists to be capable of recognizing excessively late-ACKs when under
     * heavy loss; in such case, 32 is more than enough, yet small enough that the memory footprint does not matter. */
    const quicly_sent_packet_t *sent;
    while ((sent = quicly_sentmap_get(iter))->sent_at <= retire_before && sent->cc_bytes_in_flight == 0) {
        int ret;
        if (!is_closing && loss->sentmap.num_packets < 32)
            break;
        if ((ret = quicly_sentmap_update(&loss->sentmap, iter, QUICLY_SENTMAP_EVENT_EXPIRED)) != 0)
            return ret;
    }
    return 0;
}